

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

void __thiscall
QStyleOptionToolButton::QStyleOptionToolButton
          (QStyleOptionToolButton *this,QStyleOptionToolButton *other)

{
  QStyleOptionComplex::QStyleOptionComplex(&this->super_QStyleOptionComplex,1,0xf0003);
  (this->features).super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
  super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i = 0;
  QIcon::QIcon(&this->icon);
  (this->iconSize).wd = -1;
  (this->iconSize).ht = -1;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  (this->pos).xp = 0;
  (this->pos).yp = 0;
  QFont::QFont(&this->font);
  operator=(this,other);
  return;
}

Assistant:

QStyleOptionToolButton(const QStyleOptionToolButton &other) : QStyleOptionComplex(Version, Type) { *this = other; }